

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoLinear.cpp
# Opt level: O2

int __thiscall pzgeom::TPZGeoLinear::ClassId(TPZGeoLinear *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZGeoLinear",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<2,_pztopology::TPZLine>::ClassId
                    (&this->super_TPZNodeRep<2,_pztopology::TPZLine>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoLinear::ClassId() const{
        return Hash("TPZGeoLinear") ^ TPZNodeRep<2, pztopology::TPZLine>::ClassId() << 1;
    }